

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::addActionMessage(BrokerBase *this,ActionMessage *message)

{
  bool bVar1;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *lQueue;
  ActionMessage *in_stack_00000028;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_00000030;
  
  bVar1 = isPriorityCommand((ActionMessage *)0x477637);
  if (bVar1) {
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    emplacePriority<helics::ActionMessage>(in_stack_00000030,in_stack_00000028);
  }
  else {
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    emplace<helics::ActionMessage>(in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

void BrokerBase::addActionMessage(ActionMessage&& message) const
{
    // the queue is thread safe so can be run in a const situation without possibility of issues
    auto& lQueue = const_cast<decltype(actionQueue)&>(actionQueue);
    if (isPriorityCommand(message)) {
        lQueue.emplacePriority(std::move(message));
    } else {
        // just route to the general queue;
        lQueue.emplace(std::move(message));
    }
}